

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CholeskyDecomposition.hpp
# Opt level: O2

void OpenMD::CholeskyDecomposition<OpenMD::SquareMatrix<double,6>>
               (SquareMatrix<double,_6> *A,SquareMatrix<double,_6> *L)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  double *pdVar4;
  SquareMatrix<double,_6> *pSVar5;
  double (*padVar6) [6];
  double (*padVar7) [6];
  uint k;
  long lVar8;
  uint i;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Vector<double,_6U> VStack_48;
  
  pSVar5 = A;
  SquareMatrix<double,_6>::diagonals(&VStack_48,A);
  iVar2 = Vector<double,_6U>::abs(&VStack_48,(int)pSVar5);
  dVar11 = Vector<double,_6U>::max((Vector<double,_6U> *)CONCAT44(extraout_var,iVar2));
  pdVar4 = (double *)L;
  padVar6 = (double (*) [6])L;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    dVar12 = 0.0;
    padVar7 = (double (*) [6])L;
    for (lVar8 = 0; lVar8 != lVar3; lVar8 = lVar8 + 1) {
      dVar13 = 0.0;
      for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
        dVar13 = dVar13 + ((RectMatrix<double,_6U,_6U> *)*padVar7)->data_[0][lVar9] *
                          ((RectMatrix<double,_6U,_6U> *)*padVar6)->data_[0][lVar9];
      }
      dVar1 = *(double *)((long)(L->super_RectMatrix<double,_6U,_6U>).data_ + lVar8 * 0x38);
      dVar13 = (A->super_RectMatrix<double,_6U,_6U>).data_[lVar3][lVar8] - dVar13;
      uVar10 = -(ulong)((dVar11 * 2.220446049250313e-16) / 100.0 < ABS(dVar1));
      dVar13 = (double)(~uVar10 & (ulong)dVar13 | (ulong)(dVar13 / dVar1) & uVar10);
      (L->super_RectMatrix<double,_6U,_6U>).data_[lVar3][lVar8] = dVar13;
      dVar12 = dVar12 + dVar13 * dVar13;
      padVar7 = padVar7 + 1;
    }
    dVar12 = *(double *)((long)(A->super_RectMatrix<double,_6U,_6U>).data_ + lVar3 * 0x38) - dVar12;
    if (dVar12 <= 0.0) {
      dVar12 = 0.0;
    }
    *(double *)((long)(L->super_RectMatrix<double,_6U,_6U>).data_ + lVar3 * 0x38) = SQRT(dVar12);
    for (lVar8 = 1; lVar3 + lVar8 != 6; lVar8 = lVar8 + 1) {
      pdVar4[lVar8] = 0.0;
    }
    padVar6 = padVar6 + 1;
    pdVar4 = pdVar4 + 7;
  }
  return;
}

Assistant:

void CholeskyDecomposition(MatrixType& A, MatrixType& L) {
    unsigned int n = A.getNRow();
    assert(n == A.getNCol() && n == L.getNRow() && n == L.getNCol());

    bool isspd(true);
    RealType eps =
        A.diagonals().abs().max() * (numeric_limits<RealType>::epsilon()) / 100;

    for (unsigned int j = 0; j < n; j++) {
      RealType d(0.0);
      for (unsigned int k = 0; k < j; k++) {
        RealType s(0.0);

        for (unsigned int i = 0; i < k; i++) {
          s += L(k, i) * L(j, i);
        }

        // if L(k,k) != 0
        if (std::abs(L(k, k)) > eps) {
          s = (A(j, k) - s) / L(k, k);
        } else {
          s     = (A(j, k) - s);
          isspd = false;
        }
        L(j, k) = s;
        d       = d + s * s;

        // this is approximately doing: isspd = isspd && ( A(k,j) == A(j,k) )
        isspd = isspd && (abs(A(k, j) - A(j, k)) < eps);
      }
      d       = A(j, j) - d;
      isspd   = isspd && (d > eps);
      L(j, j) = sqrt(d > 0.0 ? d : 0.0);
      for (unsigned int k = j + 1; k < n; k++) {
        L(j, k) = 0.0;
      }
    }
  }